

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O3

Byte * __thiscall
CharStringType2Interpreter::InterpretEq
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  size_t *psVar1;
  ulong uVar2;
  int iVar3;
  Trace *this_00;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *local_20;
  
  iVar3 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0x23])
                    (this->mImplementationHelper,this);
  if (iVar3 == 0) {
    uVar2 = (this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            _M_size;
    if (uVar2 < 2) {
      this_00 = Trace::DefaultTrace();
      inProgramCounter = (Byte *)0x0;
      Trace::TraceToLog(this_00,
                        "CharStringType2Interpreter::InterpretEq, eq should have at least 2 arguments on stack. got %d. aborting"
                        ,(this->mOperandStack).
                         super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>.
                         _M_impl._M_node._M_size);
    }
    else {
      p_Var4 = (this->mOperandStack).
               super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
      local_20 = p_Var4[1]._M_prev;
      p_Var5 = p_Var4[1]._M_next;
      (this->mOperandStack).super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>.
      _M_impl._M_node._M_size = uVar2 - 1;
      if (((ulong)p_Var5 & 1) != 0) {
        local_20 = (_List_node_base *)(double)(long)local_20;
      }
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var4,0x20);
      p_Var4 = (this->mOperandStack).
               super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
      p_Var5 = p_Var4[1]._M_prev;
      if (((ulong)p_Var4[1]._M_next & 1) != 0) {
        p_Var5 = (_List_node_base *)(double)(long)p_Var5;
      }
      psVar1 = &(this->mOperandStack).
                super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var4,0x20);
      p_Var4 = (_List_node_base *)operator_new(0x20);
      *(undefined1 *)&p_Var4[1]._M_next = 1;
      p_Var4[1]._M_prev =
           (_List_node_base *)(ulong)(-(uint)((double)local_20 == (double)p_Var5) & 1);
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(this->mOperandStack).
                super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
  }
  else {
    inProgramCounter = (Byte *)0x0;
  }
  return inProgramCounter;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretEq(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = mImplementationHelper->Type2Eq(mOperandStack);
	if(status != eSuccess)
		return NULL;

	CharStringOperand valueA;
	CharStringOperand valueB;
	CharStringOperand newOperand;

	if(mOperandStack.size() < 2) {
		TRACE_LOG1("CharStringType2Interpreter::InterpretEq, eq should have at least 2 arguments on stack. got %d. aborting", mOperandStack.size());
		return NULL;
	}

	valueB = mOperandStack.back();
	mOperandStack.pop_back();
	valueA = mOperandStack.back();
	mOperandStack.pop_back();


	newOperand.IsInteger = true;
	newOperand.IntegerValue = (
	(valueB.IsInteger ? valueB.IntegerValue : valueB.RealValue) ==
	(valueA.IsInteger ? valueA.IntegerValue : valueA.RealValue)
	) ? 1:0;	
	mOperandStack.push_back(newOperand);
	return inProgramCounter;
}